

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int luv_listen(lua_State *L)

{
  uint status;
  uv_stream_t *stream;
  lua_Integer lVar1;
  int iVar2;
  
  stream = luv_check_stream(L,1);
  lVar1 = luaL_checkinteger(L,2);
  iVar2 = 3;
  luv_check_callback(L,(luv_handle_t *)stream->data,1,3);
  status = uv_listen(stream,(int)lVar1,luv_connection_cb);
  if ((int)status < 0) {
    luv_error(L,status);
  }
  else {
    lua_pushinteger(L,(ulong)status);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int luv_listen(lua_State* L) {
  uv_stream_t* handle = luv_check_stream(L, 1);
  int backlog = luaL_checkinteger(L, 2);
  int ret;
  luv_check_callback(L, (luv_handle_t*)handle->data, LUV_CONNECTION, 3);
  ret = uv_listen(handle, backlog, luv_connection_cb);
  return luv_result(L, ret);
}